

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopm.c
# Opt level: O0

void OPM_EnvelopePhase4(opm_t *chip)

{
  uint8_t uVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  byte local_29;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  byte local_15;
  uint8_t slreach;
  uint8_t eg_zero;
  uint8_t eg_off;
  uint8_t kon;
  uint8_t inc;
  uint32_t slot;
  opm_t *chip_local;
  
  uVar2 = chip->cycles + 0x1e & 0x1f;
  local_15 = 0;
  if ((chip->eg_clock & 2) != 0) {
    if (chip->eg_rate[1] < 0x30) {
      if (chip->eg_zr[1] == '\0') {
        uVar1 = chip->eg_shift;
        if (uVar1 == '\f') {
          local_15 = chip->eg_rate[1] != '\0';
        }
        else if (uVar1 == '\r') {
          local_15 = (byte)((int)(uint)chip->eg_rate[1] >> 1) & 1;
        }
        else if (uVar1 == '\x0e') {
          local_15 = chip->eg_rate[1] & 1;
        }
      }
    }
    else {
      local_15 = (chip->eg_inchi + (char)((int)(uint)chip->eg_rate[1] >> 2)) - 0xb;
      if (4 < local_15) {
        local_15 = 4;
      }
    }
  }
  chip->eg_inc = local_15;
  local_21 = 0;
  if (chip->kon[uVar2] != '\0') {
    local_21 = chip->kon2[uVar2] != '\0' ^ 0xff;
  }
  local_21 = local_21 & 1;
  chip->pg_reset[uVar2] = local_21;
  local_22 = 0;
  if (chip->eg_ratemax[1] != '\0') {
    local_23 = 1;
    if (local_21 == 0) {
      local_23 = chip->eg_ratemax[1] != '\0' ^ 0xff;
    }
    local_22 = local_23;
  }
  chip->eg_instantattack = local_22 & 1;
  bVar3 = (chip->eg_level[uVar2] & 0x3f0) == 0x3f0;
  bVar4 = (int)(uint)chip->eg_level[uVar2] >> 4 == (uint)chip->eg_sl[1] << 1;
  bVar5 = chip->eg_level[uVar2] == 0;
  local_24 = 0;
  if ((bVar3) && (local_24 = 0, chip->eg_state[uVar2] != '\0')) {
    local_24 = local_21 != 0 ^ 0xff;
  }
  chip->eg_mute = local_24 & 1;
  chip->eg_inclinear = '\0';
  if ((local_21 == 0) && (!bVar3)) {
    if (chip->eg_state[uVar2] == 1) {
      if (!bVar4) {
        chip->eg_inclinear = '\x01';
      }
    }
    else if (chip->eg_state[uVar2] - 2 < 2) {
      chip->eg_inclinear = '\x01';
    }
  }
  local_29 = 0;
  if (((chip->eg_state[uVar2] == '\0') && (local_29 = 0, chip->eg_ratemax[1] == '\0')) &&
     (local_29 = 0, chip->kon[uVar2] != '\0')) {
    local_29 = bVar5 ^ 0xff;
  }
  chip->eg_incattack = local_29 & 1;
  if (local_21 == 0) {
    if (chip->kon[uVar2] == '\0') {
      chip->eg_state[uVar2] = '\x03';
    }
    else {
      switch(chip->eg_state[uVar2]) {
      case '\0':
        if (bVar5) {
          chip->eg_state[uVar2] = '\x01';
        }
        break;
      case '\x01':
        if (bVar3) {
          chip->eg_state[uVar2] = '\x03';
        }
        else if (bVar4) {
          chip->eg_state[uVar2] = '\x02';
        }
        break;
      case '\x02':
        if (bVar3) {
          chip->eg_state[uVar2] = '\x03';
        }
        break;
      case '\x03':
      }
    }
  }
  else {
    chip->eg_state[uVar2] = '\0';
  }
  if (chip->ic != '\0') {
    chip->eg_state[uVar2] = '\x03';
  }
  return;
}

Assistant:

static void OPM_EnvelopePhase4(opm_t *chip)
{
    uint32_t slot = (chip->cycles + 30) % 32;
    uint8_t inc = 0;
    uint8_t kon, eg_off, eg_zero, slreach;
    if (chip->eg_clock & 2)
    {
        if (chip->eg_rate[1] >= 48)
        {
            inc = chip->eg_inchi + (chip->eg_rate[1] >> 2) - 11;
            if (inc > 4)
            {
                inc = 4;
            }
        }
        else if (!chip->eg_zr[1])
        {
            switch (chip->eg_shift)
            {
            case 12:
                inc = chip->eg_rate[1] != 0;
                break;
            case 13:
                inc = (chip->eg_rate[1] >> 1) & 1;
                break;
            case 14:
                inc = chip->eg_rate[1] & 1;
                break;
            }
        }
    }
    chip->eg_inc = inc;

    kon = chip->kon[slot] && !chip->kon2[slot];
    chip->pg_reset[slot] = kon;
    chip->eg_instantattack = chip->eg_ratemax[1] && (kon || !chip->eg_ratemax[1]);

    eg_off = (chip->eg_level[slot] & 0x3f0) == 0x3f0;
    slreach = (chip->eg_level[slot] >> 4) == (chip->eg_sl[1] << 1);
    eg_zero = chip->eg_level[slot] == 0;

    chip->eg_mute = eg_off && chip->eg_state[slot] != eg_num_attack && !kon;
    chip->eg_inclinear = 0;
    if (!kon && !eg_off)
    {
        switch (chip->eg_state[slot])
        {
        case eg_num_decay:
            if (!slreach)
                chip->eg_inclinear = 1;
            break;
        case eg_num_sustain:
        case eg_num_release:
            chip->eg_inclinear = 1;
            break;
        }
    }
    chip->eg_incattack = chip->eg_state[slot] == eg_num_attack && !chip->eg_ratemax[1] && chip->kon[slot] && !eg_zero;


    // Update state
    if (kon)
    {
        chip->eg_state[slot] = eg_num_attack;
    }
    else if (!chip->kon[slot])
    {
        chip->eg_state[slot] = eg_num_release;
    }
    else
    {
        switch (chip->eg_state[slot])
        {
        case eg_num_attack:
            if (eg_zero)
            {
                chip->eg_state[slot] = eg_num_decay;
            }
            break;
        case eg_num_decay:
            if (eg_off)
            {
                chip->eg_state[slot] = eg_num_release;
            }
            else if (slreach)
            {
                chip->eg_state[slot] = eg_num_sustain;
            }
            break;
        case eg_num_sustain:
            if (eg_off)
            {
                chip->eg_state[slot] = eg_num_release;
            }
            break;
        case eg_num_release:
            break;
        }
    }

    if (chip->ic)
    {
        chip->eg_state[slot] = eg_num_release;
    }
}